

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_findfile.c
# Opt level: O3

char * findfile(char *fname,int dotscore)

{
  __uid_t __uid;
  char *home;
  passwd *ppVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  
  if (*fname != '\0') {
    pcVar2 = "CURL_HOME";
    lVar3 = 0;
    do {
      pcVar2 = (char *)curl_getenv(pcVar2);
      if (pcVar2 != (char *)0x0) {
        home = pcVar2;
        if (*pcVar2 != '\0') {
          if (*(long *)((long)&conf_list[0].append + lVar3) != 0) {
            home = (char *)curl_maprintf("%s%s",pcVar2);
            curl_free(pcVar2);
            if (home == (char *)0x0) {
              return (char *)0x0;
            }
          }
          pcVar2 = fname;
          if (((&conf_list[0].withoutdot)[lVar3] != true) ||
             (bVar4 = dotscore != 0, pcVar2 = fname + 1, dotscore = 0, bVar4)) {
            pcVar2 = checkhome(home,pcVar2,1 < (uint)dotscore);
            curl_free(home);
            if (pcVar2 != (char *)0x0) {
              return pcVar2;
            }
            goto LAB_0010d500;
          }
          dotscore = 0;
        }
        curl_free(home);
      }
LAB_0010d500:
      pcVar2 = *(char **)((long)&conf_list[1].env + lVar3);
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x78);
    __uid = geteuid();
    ppVar1 = getpwuid(__uid);
    if (((ppVar1 != (passwd *)0x0) && (pcVar2 = ppVar1->pw_dir, pcVar2 != (char *)0x0)) &&
       (*pcVar2 != '\0')) {
      pcVar2 = checkhome(pcVar2,fname,false);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char *findfile(const char *fname, int dotscore)
{
  int i;
  DEBUGASSERT(fname && fname[0]);
  DEBUGASSERT((dotscore != 1) || (fname[0] == '.'));

  if(!fname[0])
    return NULL;

  for(i = 0; conf_list[i].env; i++) {
    char *home = curl_getenv(conf_list[i].env);
    if(home) {
      char *path;
      const char *filename = fname;
      if(!home[0]) {
        curl_free(home);
        continue;
      }
      if(conf_list[i].append) {
        char *c = aprintf("%s%s", home, conf_list[i].append);
        curl_free(home);
        if(!c)
          return NULL;
        home = c;
      }
      if(conf_list[i].withoutdot) {
        if(!dotscore) {
          /* this is not looking for .curlrc, or the XDG_CONFIG_HOME was
             defined so we skip the extended check */
          curl_free(home);
          continue;
        }
        filename++; /* move past the leading dot */
        dotscore = 0; /* disable it for this check */
      }
      path = checkhome(home, filename, dotscore ? dotscore - 1 : 0);
      curl_free(home);
      if(path)
        return path;
    }
  }
#if defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
  {
    struct passwd *pw = getpwuid(geteuid());
    if(pw) {
      char *home = pw->pw_dir;
      if(home && home[0])
        return checkhome(home, fname, FALSE);
    }
  }
#endif /* PWD-stuff */
  return NULL;
}